

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::UntypedSwap(UntypedMapBase *this,UntypedMapBase *other)

{
  UntypedMapBase tmp;
  LogMessageFatal local_20;
  
  tmp.arena_ = this->arena_;
  if (tmp.arena_ == other->arena_) {
    InternalSwap(this,other);
    return;
  }
  tmp.type_info_ = this->type_info_;
  tmp.num_elements_ = 0;
  tmp.num_buckets_ = 1;
  tmp.index_of_first_non_null_ = 1;
  tmp.table_ = (NodeBase **)&kGlobalEmptyTable;
  InternalSwap(this,&tmp);
  if (this->num_elements_ == 0) {
    UntypedMergeFrom(this,other);
    ClearTable(other,true);
    UntypedMergeFrom(other,&tmp);
    if (this->arena_ == (Arena *)0x0) {
      ClearTable(&tmp,false);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.cc"
             ,0x62,"empty()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

void UntypedMapBase::UntypedSwap(UntypedMapBase& other) {
  if (arena() == other.arena()) {
    InternalSwap(&other);
  } else {
    UntypedMapBase tmp(arena_, type_info_);
    InternalSwap(&tmp);

    ABSL_DCHECK(empty());
    UntypedMergeFrom(other);

    other.ClearTable(true);
    other.UntypedMergeFrom(tmp);

    if (arena_ == nullptr) tmp.ClearTable(false);
  }
}